

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

void PaUtil_Set2ndInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint uVar1;
  
  uVar1 = bp->outputChannelCount;
  if (channelCount == 0) {
    channelCount = uVar1;
  }
  if (uVar1 <= firstChannel) {
    __assert_fail("firstChannel < bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                  ,0x287,
                  "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (uVar1 < channelCount + firstChannel) {
    __assert_fail("firstChannel + channelCount <= bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                  ,0x288,
                  "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->hostOutputIsInterleaved != 0) {
    for (uVar1 = 0; channelCount != uVar1; uVar1 = uVar1 + 1) {
      PaUtil_Set2ndOutputChannel(bp,firstChannel + uVar1,data,channelCount);
      data = (void *)((long)data + (ulong)bp->bytesPerHostOutputSample);
    }
    return;
  }
  __assert_fail("bp->hostOutputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                ,0x289,
                "void PaUtil_Set2ndInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_Set2ndInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );

    for( i=0; i< channelCount; ++i )
    {
        PaUtil_Set2ndOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}